

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polyline.cc
# Opt level: O0

bool __thiscall S2Polyline::Decode(S2Polyline *this,Decoder *decoder)

{
  undefined1 auVar1 [16];
  Decoder *this_00;
  bool bVar2;
  uint32 uVar3;
  size_t sVar4;
  ulong uVar5;
  ulong uVar6;
  Vector3<double> *__p;
  type dst;
  ostream *poVar7;
  Vector3<double> *local_78;
  S2LogMessage local_48;
  S2LogMessageVoidify local_35 [20];
  byte local_21;
  Decoder *pDStack_20;
  uchar version;
  Decoder *decoder_local;
  S2Polyline *this_local;
  
  pDStack_20 = decoder;
  decoder_local = (Decoder *)this;
  sVar4 = Decoder::avail(decoder);
  if (sVar4 < 5) {
    this_local._7_1_ = false;
  }
  else {
    local_21 = Decoder::get8(pDStack_20);
    if (local_21 < 2) {
      uVar3 = Decoder::get32(pDStack_20);
      this->num_vertices_ = uVar3;
      uVar5 = (ulong)this->num_vertices_;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = uVar5;
      uVar6 = SUB168(auVar1 * ZEXT816(0x18),0);
      if (SUB168(auVar1 * ZEXT816(0x18),8) != 0) {
        uVar6 = 0xffffffffffffffff;
      }
      __p = (Vector3<double> *)operator_new__(uVar6);
      if (uVar5 != 0) {
        local_78 = __p;
        do {
          Vector3<double>::Vector3(local_78);
          local_78 = local_78 + 1;
        } while (local_78 != __p + uVar5);
      }
      std::unique_ptr<Vector3<double>[],std::default_delete<Vector3<double>[]>>::
      reset<Vector3<double>*,void>
                ((unique_ptr<Vector3<double>[],std::default_delete<Vector3<double>[]>> *)
                 &this->vertices_,__p);
      sVar4 = Decoder::avail(pDStack_20);
      this_00 = pDStack_20;
      if (sVar4 < (ulong)((long)this->num_vertices_ * 0x18)) {
        this_local._7_1_ = false;
      }
      else {
        dst = std::unique_ptr<Vector3<double>[],_std::default_delete<Vector3<double>[]>_>::
              operator[](&this->vertices_,0);
        Decoder::getn(this_00,dst,(long)this->num_vertices_ * 0x18);
        if ((((FLAGS_s2debug & 1U) != 0) && (this->s2debug_override_ == ALLOW)) &&
           (bVar2 = IsValid(this), ((bVar2 ^ 0xffU) & 1) != 0)) {
          S2FatalLogMessage::S2FatalLogMessage
                    ((S2FatalLogMessage *)&local_48,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2polyline.cc"
                     ,0x16f,kFatal,(ostream *)&std::cerr);
          poVar7 = S2LogMessage::stream(&local_48);
          poVar7 = std::operator<<(poVar7,"Check failed: IsValid() ");
          S2LogMessageVoidify::operator&(local_35,poVar7);
          S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_48);
        }
        this_local._7_1_ = true;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool S2Polyline::Decode(Decoder* const decoder) {
  if (decoder->avail() < sizeof(unsigned char) + sizeof(uint32)) return false;
  unsigned char version = decoder->get8();
  if (version > kCurrentLosslessEncodingVersionNumber) return false;

  num_vertices_ = decoder->get32();
  vertices_.reset(new S2Point[num_vertices_]);
  if (decoder->avail() < num_vertices_ * sizeof(vertices_[0])) return false;
  decoder->getn(&vertices_[0], num_vertices_ * sizeof(vertices_[0]));

  if (FLAGS_s2debug && s2debug_override_ == S2Debug::ALLOW) {
    S2_CHECK(IsValid());
  }
  return true;
}